

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  CartesianProduct merged;
  RealSpace *local_418;
  SO3<mnf::ExpMapQuaternion> *local_410;
  RealSpace R3;
  RobotManifold robot2;
  RobotManifold robot1;
  S2 s2;
  RealSpace R8;
  CartesianProduct se3;
  SO3<mnf::ExpMapQuaternion> so3;
  
  mnf::CartesianProduct::CartesianProduct(&merged);
  mnf::RealSpace::RealSpace(&R8,8);
  mnf::RealSpace::RealSpace(&R3,3);
  mnf::S2::S2(&s2);
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&so3);
  RobotManifold::RobotManifold(&robot1);
  mnf::CartesianProduct::multiply((Manifold *)&robot1);
  mnf::Manifold::display();
  RobotManifold::RobotManifold(&robot2);
  local_418 = &R3;
  local_410 = &so3;
  mnf::CartesianProduct::CartesianProduct(&se3,&local_418,2);
  mnf::CartesianProduct::multiply((Manifold *)&robot2);
  mnf::Manifold::display();
  mnf::CartesianProduct::multiply((Manifold *)&merged);
  mnf::Manifold::display();
  mnf::CartesianProduct::multiply((Manifold *)&merged);
  mnf::CartesianProduct::multiply((Manifold *)&merged);
  mnf::CartesianProduct::multiply((Manifold *)&merged);
  mnf::CartesianProduct::multiply((Manifold *)&merged);
  mnf::CartesianProduct::multiply((Manifold *)&merged);
  mnf::Manifold::display();
  mnf::CartesianProduct::~CartesianProduct(&se3);
  mnf::CartesianProduct::~CartesianProduct(&robot2.super_CartesianProduct);
  mnf::CartesianProduct::~CartesianProduct(&robot1.super_CartesianProduct);
  mnf::SO3<mnf::ExpMapQuaternion>::~SO3(&so3);
  mnf::Manifold::~Manifold((Manifold *)&s2);
  mnf::RealSpace::~RealSpace(&R3);
  mnf::RealSpace::~RealSpace(&R8);
  mnf::CartesianProduct::~CartesianProduct(&merged);
  return 0;
}

Assistant:

int main()
{
  CartesianProduct merged;
  RealSpace R8(8);
  RealSpace R3(3);
  S2 s2;
  SO3<ExpMapQuaternion> so3;
  RobotManifold robot1;
  robot1.multiply(R8);
  robot1.display();
  RobotManifold robot2;
  CartesianProduct se3{&R3, &so3};
  robot2.multiply(se3);
  robot2.display();
  merged.multiply(robot1);
  merged.display();
  merged.multiply(robot2);
  merged.multiply(s2);
  merged.multiply(R3);
  merged.multiply(s2);
  merged.multiply(R3);
  merged.display();
  return 0;
}